

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  rar_br *br;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  uchar *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  void *pvVar13;
  uLong uVar14;
  long lVar15;
  ulong uVar16;
  char *fmt;
  uint uVar17;
  uint uVar18;
  void *pvVar19;
  void *__dest;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  
LAB_003d62c0:
  pvVar4 = a->format->data;
  p = (CPpmd7 *)((long)pvVar4 + 0x398);
  rc = (IPpmd7_RangeDec *)((long)pvVar4 + 0x4e88);
  uVar21 = 0;
  do {
    if (*(char *)((long)pvVar4 + 0xd0) == '\0') {
LAB_003d6f68:
      uVar21 = 0xffffffe2;
      goto LAB_003d7054;
    }
    if ((*(char *)((long)pvVar4 + 0x392) != '\0') ||
       ((*(int *)((long)pvVar4 + 0xe8) != 0 &&
        (*(long *)((long)pvVar4 + 0x28) <= *(long *)((long)pvVar4 + 0xb8))))) {
      uVar7 = *(uint *)((long)pvVar4 + 0xd4);
      if ((ulong)uVar7 != 0) {
        puVar5 = *(uchar **)((long)pvVar4 + 0xe0);
        *buff = puVar5;
        *size = (ulong)uVar7;
        *offset = *(int64_t *)((long)pvVar4 + 0xc0);
        *(long *)((long)pvVar4 + 0xc0) = *(long *)((long)pvVar4 + 0xc0) + *size;
        uVar14 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar4 + 0xf0),puVar5,(uint)*size);
        *(uLong *)((long)pvVar4 + 0xf0) = uVar14;
        *(undefined4 *)((long)pvVar4 + 0xd4) = 0;
LAB_003d7051:
        uVar21 = 0;
        goto LAB_003d7054;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar4 + 0xb8);
      if (*(long *)((long)pvVar4 + 8) == *(long *)((long)pvVar4 + 0xf0)) {
        *(undefined1 *)((long)pvVar4 + 0xed) = 1;
        uVar21 = 1;
        goto LAB_003d7054;
      }
      fmt = "File CRC error";
LAB_003d6f59:
      archive_set_error(&a->archive,0x54,fmt);
      goto LAB_003d6f68;
    }
    if (((*(int *)((long)pvVar4 + 0xe8) == 0) || (*(char *)((long)pvVar4 + 0x393) != '\0')) ||
       (uVar16 = *(ulong *)((long)pvVar4 + 0xb0), (long)uVar16 < 1)) {
      if (*(long *)((long)pvVar4 + 0x4f08) == 0) {
        if (*(long *)((long)a->format->data + 0xa8) < 1) {
LAB_003d6409:
          bVar6 = false;
          uVar21 = 0;
        }
        else {
          pvVar13 = rar_read_ahead(a,1,(ssize_t *)((long)pvVar4 + 0x4f00));
          *(void **)((long)pvVar4 + 0x4f08) = pvVar13;
          if (pvVar13 == (void *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated RAR file data");
            uVar21 = 0xffffffe2;
            bVar6 = true;
          }
          else {
            bVar6 = false;
            uVar21 = 0;
            if (*(int *)((long)pvVar4 + 0x4ef8) == 0) {
              rar_br_fillup(a,(rar_br *)((long)pvVar4 + 0x4ef0));
              goto LAB_003d6409;
            }
          }
        }
        if (bVar6) goto LAB_003d7054;
      }
      if (*(char *)((long)pvVar4 + 0x390) != '\0') {
        uVar7 = parse_codes(a);
        uVar21 = (ulong)uVar7;
        if ((int)uVar7 < -0x14) goto LAB_003d7054;
      }
      if (*(char *)((long)pvVar4 + 0x393) == '\0') {
        lVar22 = *(long *)((long)pvVar4 + 0xb8);
        lVar15 = (ulong)*(uint *)((long)pvVar4 + 0xe8) + lVar22;
        *(undefined8 *)((long)pvVar4 + 0x388) = 0x7fffffffffffffff;
        pvVar13 = a->format->data;
        br = (rar_br *)((long)pvVar13 + 0x4ef0);
        if (*(long *)((long)pvVar13 + 0x388) < lVar15) {
          lVar15 = *(long *)((long)pvVar13 + 0x388);
        }
        piVar1 = (int *)((long)pvVar13 + 0x36c);
        do {
          while( true ) {
            while( true ) {
              if (*(char *)((long)pvVar13 + 0x360) != '\0') {
                uVar7 = *(uint *)((long)pvVar13 + 0x364);
                if ((long)(*(long *)((long)pvVar13 + 0x358) + (ulong)uVar7) <= lVar15) {
                  if (0 < (int)uVar7) {
                    uVar10 = (uint)*(long *)((long)pvVar13 + 0x358) &
                             *(uint *)((long)pvVar13 + 0x350);
                    uVar17 = uVar10 - *(int *)((long)pvVar13 + 0x368) &
                             *(uint *)((long)pvVar13 + 0x350);
                    uVar12 = uVar7;
                    do {
                      uVar20 = uVar17;
                      if ((int)uVar17 < (int)uVar10) {
                        uVar20 = uVar10;
                      }
                      uVar20 = (*(int *)((long)pvVar13 + 0x350) - uVar20) + 1;
                      if ((int)uVar12 < (int)uVar20) {
                        uVar20 = uVar12;
                      }
                      __dest = (void *)((long)(int)uVar10 + *(long *)((long)pvVar13 + 0x348));
                      pvVar19 = (void *)(*(long *)((long)pvVar13 + 0x348) + (long)(int)uVar17);
                      if (((int)(uVar10 + uVar20) < (int)uVar17) ||
                         ((int)(uVar17 + uVar20) < (int)uVar10)) {
                        memcpy(__dest,pvVar19,(long)(int)uVar20);
                      }
                      else if (0 < (int)uVar20) {
                        uVar21 = 0;
                        do {
                          *(undefined1 *)((long)__dest + uVar21) =
                               *(undefined1 *)((long)pvVar19 + uVar21);
                          uVar21 = uVar21 + 1;
                        } while (uVar20 != uVar21);
                      }
                      uVar10 = uVar10 + uVar20 & *(uint *)((long)pvVar13 + 0x350);
                      uVar17 = uVar17 + uVar20 & *(uint *)((long)pvVar13 + 0x350);
                      uVar18 = uVar12 - uVar20;
                      bVar6 = (int)uVar20 <= (int)uVar12;
                      uVar12 = uVar18;
                    } while (uVar18 != 0 && bVar6);
                  }
                  *(long *)((long)pvVar13 + 0x358) =
                       *(long *)((long)pvVar13 + 0x358) + (long)(int)uVar7;
                  *(undefined1 *)((long)pvVar13 + 0x360) = 0;
                }
              }
              if (((*(char *)((long)pvVar13 + 0x393) != '\0') ||
                  (*(char *)((long)pvVar13 + 0x360) != '\0')) ||
                 (lVar15 <= *(long *)((long)pvVar13 + 0x358))) {
                uVar21 = *(ulong *)((long)pvVar13 + 0x358);
                goto LAB_003d6bd8;
              }
              iVar8 = read_next_symbol(a,(huffman_code *)((long)pvVar13 + 0x110));
              uVar21 = 0xffffffffffffffe2;
              if (iVar8 < 0) goto LAB_003d6bd8;
              *(undefined1 *)((long)pvVar13 + 0x360) = 0;
              if (0xff < iVar8) break;
              *(char *)(*(long *)((long)pvVar13 + 0x348) +
                       (long)(int)(*(uint *)((long)pvVar13 + 0x350) &
                                  *(uint *)((long)pvVar13 + 0x358))) = (char)iVar8;
              *(long *)((long)pvVar13 + 0x358) = *(long *)((long)pvVar13 + 0x358) + 1;
            }
            if (iVar8 == 0x100) break;
            if (iVar8 == 0x102) {
              iVar9 = *(int *)((long)pvVar13 + 0x364);
              if (iVar9 != 0) {
                iVar23 = *(int *)((long)pvVar13 + 0x368);
                goto LAB_003d6b79;
              }
            }
            else {
              if (iVar8 == 0x101) {
                archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                uVar21 = 0xffffffffffffffe7;
                goto LAB_003d6bd8;
              }
              if (iVar8 < 0x107) {
                iVar23 = piVar1[iVar8 - 0x103];
                uVar7 = read_next_symbol(a,(huffman_code *)((long)pvVar13 + 0x188));
                if (0x1c < uVar7) goto LAB_003d6e99;
                iVar9 = (byte)expand_lengthbases[uVar7] + 2;
                if (7 < uVar7) {
                  bVar2 = expand_lengthbits[uVar7];
                  if (((*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2) &&
                      (iVar11 = rar_br_fillup(a,br), iVar11 == 0)) &&
                     (*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2)) goto LAB_003d6eb9;
                  iVar11 = *(int *)((long)pvVar13 + 0x4ef8) - (uint)bVar2;
                  iVar9 = ((uint)(*(ulong *)((long)pvVar13 + 0x4ef0) >> ((byte)iVar11 & 0x3f)) &
                          cache_masks[bVar2]) + iVar9;
                  *(int *)((long)pvVar13 + 0x4ef8) = iVar11;
                }
                uVar21 = (ulong)(iVar8 - 0x103);
                if (0x103 < iVar8) {
                  do {
                    piVar1[uVar21] = *(int *)((long)pvVar13 + uVar21 * 4 + 0x368);
                    bVar6 = 1 < (long)uVar21;
                    uVar21 = uVar21 - 1;
                  } while (bVar6);
                }
                *piVar1 = iVar23;
              }
              else {
                if (0x10e < iVar8) {
                  if (iVar8 < 300) {
                    uVar7 = iVar8 - 0x10f;
                    iVar8 = (byte)expand_lengthbases[uVar7] + 3;
                    if (7 < uVar7) {
                      bVar2 = expand_lengthbits[uVar7];
                      if (((*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2) &&
                          (iVar9 = rar_br_fillup(a,br), iVar9 == 0)) &&
                         (*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2)) goto LAB_003d6eb9;
                      iVar9 = *(int *)((long)pvVar13 + 0x4ef8) - (uint)bVar2;
                      iVar8 = ((uint)(*(ulong *)((long)pvVar13 + 0x4ef0) >> ((byte)iVar9 & 0x3f)) &
                              cache_masks[bVar2]) + iVar8;
                      *(int *)((long)pvVar13 + 0x4ef8) = iVar9;
                    }
                    uVar7 = read_next_symbol(a,(huffman_code *)((long)pvVar13 + 0x138));
                    if (uVar7 < 0x3d) {
                      uVar16 = (ulong)uVar7;
                      iVar23 = *(int *)(expand_offsetbases + uVar16 * 4) + 1;
                      if (3 < uVar7) {
                        bVar2 = expand_offsetbits[uVar16];
                        if ((int)uVar7 < 10) {
                          if (((*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2) &&
                              (iVar9 = rar_br_fillup(a,br), iVar9 == 0)) &&
                             (*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar2))
                          goto LAB_003d6eb9;
                          iVar9 = *(int *)((long)pvVar13 + 0x4ef8) - (uint)bVar2;
                          iVar23 = ((uint)(*(ulong *)((long)pvVar13 + 0x4ef0) >>
                                          ((byte)iVar9 & 0x3f)) & cache_masks[bVar2]) + iVar23;
                          *(int *)((long)pvVar13 + 0x4ef8) = iVar9;
                        }
                        else {
                          if (uVar16 - 0xc < 0x30) {
                            iVar9 = bVar2 - 4;
                            if (((*(int *)((long)pvVar13 + 0x4ef8) < iVar9) &&
                                (iVar11 = rar_br_fillup(a,br), iVar11 == 0)) &&
                               (*(int *)((long)pvVar13 + 0x4ef8) < iVar9)) goto LAB_003d6eb9;
                            iVar9 = *(int *)((long)pvVar13 + 0x4ef8) - iVar9;
                            iVar23 = ((uint)(*(ulong *)((long)pvVar13 + 0x4ef0) >>
                                            ((byte)iVar9 & 0x3f)) & (&UINT_004e1650)[bVar2]) * 0x10
                                     + iVar23;
                            *(int *)((long)pvVar13 + 0x4ef8) = iVar9;
                          }
                          if (*(int *)((long)pvVar13 + 0x380) == 0) {
                            iVar9 = read_next_symbol(a,(huffman_code *)((long)pvVar13 + 0x160));
                            if (iVar9 < 0) goto LAB_003d6bd8;
                            if (iVar9 == 0x10) {
                              *(undefined4 *)((long)pvVar13 + 0x380) = 0xf;
                              goto LAB_003d6b3c;
                            }
                            *(int *)((long)pvVar13 + 0x37c) = iVar9;
                          }
                          else {
                            *(int *)((long)pvVar13 + 0x380) = *(int *)((long)pvVar13 + 0x380) + -1;
LAB_003d6b3c:
                            iVar9 = *(int *)((long)pvVar13 + 0x37c);
                          }
                          iVar23 = iVar23 + iVar9;
                        }
                      }
                      *(undefined4 *)((long)pvVar13 + 0x378) =
                           *(undefined4 *)((long)pvVar13 + 0x374);
                      *(undefined8 *)((long)pvVar13 + 0x370) = *(undefined8 *)piVar1;
                      iVar9 = iVar8 + (uint)(0x3ffff < iVar23) + (uint)(0x1fff < iVar23);
                      *piVar1 = iVar23;
                      goto LAB_003d6b79;
                    }
                  }
LAB_003d6e99:
                  archive_set_error(&a->archive,0x54,"Bad RAR file data");
                  goto LAB_003d6bd8;
                }
                bVar2 = *(byte *)((long)&expand_shortbases + (ulong)(iVar8 - 0x107));
                bVar3 = *(byte *)((long)&expand_shortbits + (ulong)(iVar8 - 0x107));
                if (((*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar3) &&
                    (iVar8 = rar_br_fillup(a,br), iVar8 == 0)) &&
                   (*(int *)((long)pvVar13 + 0x4ef8) < (int)(uint)bVar3)) goto LAB_003d6eb9;
                iVar8 = *(int *)((long)pvVar13 + 0x4ef8) - (uint)bVar3;
                *(int *)((long)pvVar13 + 0x4ef8) = iVar8;
                *(undefined4 *)((long)pvVar13 + 0x378) = *(undefined4 *)((long)pvVar13 + 0x374);
                *(undefined8 *)((long)pvVar13 + 0x370) = *(undefined8 *)piVar1;
                iVar23 = ((uint)(*(ulong *)((long)pvVar13 + 0x4ef0) >> ((byte)iVar8 & 0x3f)) &
                         cache_masks[bVar3]) + bVar2 + 1;
                *(int *)((long)pvVar13 + 0x36c) = iVar23;
                iVar9 = 2;
              }
LAB_003d6b79:
              *(int *)((long)pvVar13 + 0x368) = iVar23;
              *(int *)((long)pvVar13 + 0x364) = iVar9;
              *(undefined1 *)((long)pvVar13 + 0x360) = 1;
            }
          }
          if (((*(int *)((long)pvVar13 + 0x4ef8) < 1) && (iVar8 = rar_br_fillup(a,br), iVar8 == 0))
             && (*(int *)((long)pvVar13 + 0x4ef8) < 1)) {
LAB_003d6eb9:
            archive_set_error(&a->archive,0x54,"Truncated RAR file data");
            *(undefined1 *)((long)pvVar13 + 0xd0) = 0;
            break;
          }
          iVar8 = *(int *)((long)pvVar13 + 0x4ef8);
          uVar7 = iVar8 - 1;
          *(uint *)((long)pvVar13 + 0x4ef8) = uVar7;
          if ((*(ulong *)((long)pvVar13 + 0x4ef0) >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
            *(undefined1 *)((long)pvVar13 + 0xec) = 1;
            if (((iVar8 < 2) && (iVar8 = rar_br_fillup(a,br), iVar8 == 0)) &&
               (*(int *)((long)pvVar13 + 0x4ef8) < 1)) goto LAB_003d6eb9;
            uVar7 = *(int *)((long)pvVar13 + 0x4ef8) - 1;
            *(bool *)((long)pvVar13 + 0x390) =
                 (*(ulong *)((long)pvVar13 + 0x4ef0) >> ((ulong)uVar7 & 0x3f) & 1) != 0;
            *(uint *)((long)pvVar13 + 0x4ef8) = uVar7;
            uVar21 = *(ulong *)((long)pvVar13 + 0x358);
            break;
          }
          iVar8 = parse_codes(a);
        } while (iVar8 == 0);
LAB_003d6bd8:
        if ((long)uVar21 < 0) goto LAB_003d7054;
        lVar22 = uVar21 - lVar22;
        *(long *)((long)pvVar4 + 0xb0) = lVar22;
        if (lVar22 == 0) {
          fmt = "Internal error extracting RAR file";
          goto LAB_003d6f59;
        }
      }
      else {
        iVar8 = Ppmd7_DecodeSymbol(p,rc);
        if (iVar8 < 0) {
LAB_003d6f52:
          fmt = "Invalid symbol";
          goto LAB_003d6f59;
        }
        if (iVar8 == *(int *)((long)pvVar4 + 0x394)) {
          iVar9 = Ppmd7_DecodeSymbol(p,rc);
          if (iVar9 < 0) goto LAB_003d6f52;
          switch(iVar9) {
          case 0:
            goto switchD_003d64af_caseD_0;
          default:
            goto switchD_003d64af_caseD_1;
          case 2:
            *(undefined1 *)((long)pvVar4 + 0x392) = 1;
            goto LAB_003d6dfb;
          case 3:
            archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
            uVar21 = 0xffffffe7;
            goto LAB_003d7054;
          case 4:
            uVar7 = 0;
            iVar8 = 0x10;
            do {
              iVar9 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar9 < 0) goto LAB_003d6f52;
              uVar7 = uVar7 | iVar9 << ((byte)iVar8 & 0x1f);
              iVar8 = iVar8 + -8;
            } while (iVar8 != -8);
            iVar8 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar8 < 0) goto LAB_003d6f52;
            uVar17 = iVar8 + 0x20;
            uVar12 = *(uint *)((long)pvVar4 + 0x358) & *(uint *)((long)pvVar4 + 0x350);
            uVar10 = (uVar12 - uVar7) - 2 & *(uint *)((long)pvVar4 + 0x350);
            uVar7 = uVar17;
            do {
              uVar20 = uVar10;
              if ((int)uVar10 < (int)uVar12) {
                uVar20 = uVar12;
              }
              uVar20 = (*(int *)((long)pvVar4 + 0x350) - uVar20) + 1;
              if ((int)uVar7 < (int)uVar20) {
                uVar20 = uVar7;
              }
              pvVar19 = (void *)((long)(int)uVar12 + *(long *)((long)pvVar4 + 0x348));
              pvVar13 = (void *)(*(long *)((long)pvVar4 + 0x348) + (long)(int)uVar10);
              if (((int)(uVar20 + uVar12) < (int)uVar10) || ((int)(uVar20 + uVar10) < (int)uVar12))
              {
                memcpy(pvVar19,pvVar13,(long)(int)uVar20);
              }
              else if (0 < (int)uVar20) {
                uVar21 = 0;
                do {
                  *(undefined1 *)((long)pvVar19 + uVar21) = *(undefined1 *)((long)pvVar13 + uVar21);
                  uVar21 = uVar21 + 1;
                } while (uVar20 != uVar21);
              }
              uVar12 = uVar20 + uVar12 & *(uint *)((long)pvVar4 + 0x350);
              uVar10 = uVar20 + uVar10 & *(uint *)((long)pvVar4 + 0x350);
              uVar18 = uVar7 - uVar20;
              bVar6 = (int)uVar20 <= (int)uVar7;
              uVar7 = uVar18;
            } while (uVar18 != 0 && bVar6);
            break;
          case 5:
            iVar8 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar8 < 0) goto LAB_003d6f52;
            uVar17 = iVar8 + 4;
            uVar12 = *(uint *)((long)pvVar4 + 0x358) & *(uint *)((long)pvVar4 + 0x350);
            uVar10 = uVar12 - 1 & *(uint *)((long)pvVar4 + 0x350);
            uVar7 = uVar17;
            do {
              uVar20 = uVar10;
              if ((int)uVar10 < (int)uVar12) {
                uVar20 = uVar12;
              }
              uVar20 = (*(int *)((long)pvVar4 + 0x350) - uVar20) + 1;
              if ((int)uVar7 < (int)uVar20) {
                uVar20 = uVar7;
              }
              pvVar19 = (void *)((long)(int)uVar12 + *(long *)((long)pvVar4 + 0x348));
              pvVar13 = (void *)(*(long *)((long)pvVar4 + 0x348) + (long)(int)uVar10);
              if (((int)(uVar20 + uVar12) < (int)uVar10) || ((int)(uVar20 + uVar10) < (int)uVar12))
              {
                memcpy(pvVar19,pvVar13,(long)(int)uVar20);
              }
              else if (0 < (int)uVar20) {
                uVar21 = 0;
                do {
                  *(undefined1 *)((long)pvVar19 + uVar21) = *(undefined1 *)((long)pvVar13 + uVar21);
                  uVar21 = uVar21 + 1;
                } while (uVar20 != uVar21);
              }
              uVar12 = uVar20 + uVar12 & *(uint *)((long)pvVar4 + 0x350);
              uVar10 = uVar20 + uVar10 & *(uint *)((long)pvVar4 + 0x350);
              uVar18 = uVar7 - uVar20;
              bVar6 = (int)uVar20 <= (int)uVar7;
              uVar7 = uVar18;
            } while (uVar18 != 0 && bVar6);
          }
          *(long *)((long)pvVar4 + 0x358) = *(long *)((long)pvVar4 + 0x358) + (ulong)uVar17;
        }
        else {
switchD_003d64af_caseD_1:
          *(char *)(*(long *)((long)pvVar4 + 0x348) +
                   (long)(int)(*(uint *)((long)pvVar4 + 0x350) & *(uint *)((long)pvVar4 + 0x358))) =
               (char)iVar8;
          *(long *)((long)pvVar4 + 0x358) = *(long *)((long)pvVar4 + 0x358) + 1;
          uVar17 = 1;
        }
        *(long *)((long)pvVar4 + 0xb0) = *(long *)((long)pvVar4 + 0xb0) + (ulong)uVar17;
      }
      uVar21 = (ulong)(uint)(*(int *)((long)pvVar4 + 0xd8) - *(int *)((long)pvVar4 + 0xd4));
      if ((long)*(ulong *)((long)pvVar4 + 0xb0) < (long)uVar21) {
        uVar21 = *(ulong *)((long)pvVar4 + 0xb0);
      }
      uVar7 = copy_from_lzss_window(a,buff,*(int64_t *)((long)pvVar4 + 0xb8),(int)uVar21);
      if (uVar7 != 0) goto LAB_003d6fbe;
      *(long *)((long)pvVar4 + 0xb8) = *(long *)((long)pvVar4 + 0xb8) + uVar21;
      *(long *)((long)pvVar4 + 0xb0) = *(long *)((long)pvVar4 + 0xb0) - uVar21;
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)(uint)(*(int *)((long)pvVar4 + 0xd8) - *(int *)((long)pvVar4 + 0xd4));
      if ((long)uVar16 < (long)uVar21) {
        uVar21 = uVar16;
      }
      uVar7 = copy_from_lzss_window(a,buff,*(int64_t *)((long)pvVar4 + 0xb8),(int)uVar21);
      if (uVar7 != 0) {
LAB_003d6fbe:
        uVar21 = (ulong)uVar7;
        goto LAB_003d7054;
      }
      *(long *)((long)pvVar4 + 0xb8) = *(long *)((long)pvVar4 + 0xb8) + uVar21;
      *(long *)((long)pvVar4 + 0xb0) = *(long *)((long)pvVar4 + 0xb0) - uVar21;
      puVar5 = (uchar *)*buff;
      uVar21 = 0;
      if (puVar5 != (uchar *)0x0) {
        *(undefined4 *)((long)pvVar4 + 0xd4) = 0;
        *size = (ulong)*(uint *)((long)pvVar4 + 0xd8);
        *offset = *(int64_t *)((long)pvVar4 + 0xc0);
        *(long *)((long)pvVar4 + 0xc0) = *(long *)((long)pvVar4 + 0xc0) + *size;
        uVar14 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar4 + 0xf0),puVar5,(uint)*size);
        *(uLong *)((long)pvVar4 + 0xf0) = uVar14;
        goto LAB_003d7051;
      }
    }
LAB_003d6dfb:
    puVar5 = (uchar *)*buff;
    if (puVar5 != (uchar *)0x0) {
      *(undefined4 *)((long)pvVar4 + 0xd4) = 0;
      *size = (ulong)*(uint *)((long)pvVar4 + 0xd8);
      *offset = *(int64_t *)((long)pvVar4 + 0xc0);
      *(long *)((long)pvVar4 + 0xc0) = *(long *)((long)pvVar4 + 0xc0) + *size;
      uVar14 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar4 + 0xf0),puVar5,(uint)*size);
      *(uLong *)((long)pvVar4 + 0xf0) = uVar14;
LAB_003d7054:
      return (int)uVar21;
    }
  } while( true );
switchD_003d64af_caseD_0:
  *(undefined1 *)((long)pvVar4 + 0x390) = 1;
  goto LAB_003d62c0;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
               int64_t *offset)
{
  struct rar *rar;
  int64_t start, end, actualend;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);
    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      rar->filterstart = INT64_MAX;

      if ((actualend = expand(a, end)) < 0)
        return ((int)actualend);

      rar->bytes_uncopied = actualend - start;
      if (rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}